

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csnode_bmod.c
# Opt level: O0

int csnode_bmod(int jcol,int jsupno,int fsupc,singlecomplex *dense,singlecomplex *tempv,
               GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  int iVar1;
  flops_t *pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int ldm;
  int ncol;
  int nrow_00;
  int local_90;
  int local_8c;
  int_t iptr;
  int_t i;
  flops_t *ops;
  int_t luptr;
  int_t *xlusup;
  singlecomplex *lusup;
  int_t *xlsub;
  int_t *lsub;
  int_t nextlu;
  int_t ufirst;
  int_t irow;
  int_t isub;
  int nrow;
  int nsupr;
  int nsupc;
  singlecomplex comp_zero;
  GlobalLU_t *Glu_local;
  singlecomplex *tempv_local;
  singlecomplex *dense_local;
  int fsupc_local;
  int jsupno_local;
  int jcol_local;
  
  comp_zero = (singlecomplex)Glu;
  memset(&nsupr,0,8);
  pfVar2 = stat->ops;
  lVar3 = *(long *)((long)comp_zero + 0x10);
  lVar4 = *(long *)((long)comp_zero + 0x18);
  lVar5 = *(long *)((long)comp_zero + 0x20);
  lVar6 = *(long *)((long)comp_zero + 0x28);
  lsub._4_4_ = *(int *)(lVar6 + (long)jcol * 4);
  for (ufirst = *(int_t *)(lVar4 + (long)fsupc * 4);
      ufirst < *(int *)(lVar4 + (long)(fsupc + 1) * 4); ufirst = ufirst + 1) {
    iVar1 = *(int *)(lVar3 + (long)ufirst * 4);
    *(singlecomplex *)(lVar5 + (long)lsub._4_4_ * 8) = dense[iVar1];
    dense[iVar1] = _nsupr;
    lsub._4_4_ = lsub._4_4_ + 1;
  }
  *(int *)(lVar6 + (long)(jcol + 1) * 4) = lsub._4_4_;
  if (fsupc < jcol) {
    iVar1 = *(int *)(lVar6 + (long)fsupc * 4);
    ldm = *(int *)(lVar4 + (long)(fsupc + 1) * 4) - *(int *)(lVar4 + (long)fsupc * 4);
    ncol = jcol - fsupc;
    local_90 = *(int *)(lVar6 + (long)jcol * 4);
    nrow_00 = ldm - ncol;
    pfVar2[0x13] = (float)(ncol * 4 * (ncol + -1)) + pfVar2[0x13];
    pfVar2[0x14] = (float)(nrow_00 * 8 * ncol) + pfVar2[0x14];
    clsolve(ldm,ncol,(singlecomplex *)(lVar5 + (long)iVar1 * 8),
            (singlecomplex *)(lVar5 + (long)local_90 * 8));
    cmatvec(ldm,nrow_00,ncol,(singlecomplex *)(lVar5 + (long)(iVar1 + ncol) * 8),
            (singlecomplex *)(lVar5 + (long)local_90 * 8),tempv);
    local_90 = local_90 + ncol;
    for (local_8c = 0; local_8c < nrow_00; local_8c = local_8c + 1) {
      *(float *)(lVar5 + (long)local_90 * 8) =
           *(float *)(lVar5 + (long)local_90 * 8) - tempv[local_8c].r;
      *(float *)(lVar5 + 4 + (long)local_90 * 8) =
           *(float *)(lVar5 + 4 + (long)local_90 * 8) - tempv[local_8c].i;
      local_90 = local_90 + 1;
      tempv[local_8c] = _nsupr;
    }
  }
  return 0;
}

Assistant:

int
csnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    singlecomplex     *dense,    /* in */
	    singlecomplex     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    singlecomplex         alpha = {-1.0, 0.0},  beta = {1.0, 0.0};
#endif

    singlecomplex   comp_zero = {0.0, 0.0};
    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    singlecomplex *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = comp_zero;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	ctrsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	cgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	clsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	cmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    c_sub(&lusup[iptr], &lusup[iptr], &tempv[i]);
            ++iptr;
	    tempv[i] = comp_zero;
	}
#endif

    }

    return 0;
}